

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Method method,
          StructSchema type,StringPtr suffix)

{
  Reader proto;
  uint uVar1;
  uint64_t uVar2;
  CppTypeName *other;
  StringPtr *params_1;
  CppTypeName local_230;
  Schema local_1f0;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_1e8;
  ArrayPtr<const_char> local_1d0;
  ArrayPtr<const_char> local_1c0;
  Reader local_1b0;
  Reader local_180;
  ArrayPtr<const_char> local_150;
  String local_140;
  undefined1 local_128 [8];
  String memberTypeName;
  Maybe<capnp::InterfaceSchema::Method> local_f8;
  Schema local_b0;
  Schema local_a8;
  undefined1 local_a0 [8];
  CppTypeName name;
  Reader typeProto;
  CapnpcCppMain *this_local;
  StringPtr suffix_local;
  StructSchema type_local;
  
  suffix_local.content.ptr = (char *)suffix.content.size_;
  this_local = (CapnpcCppMain *)suffix.content.ptr;
  suffix_local.content.size_ = (size_t)type.super_Schema.raw;
  Schema::getProto((Reader *)&name.isArgDependent,(Schema *)&suffix_local.content.size_);
  uVar2 = capnp::schema::Node::Reader::getScopeId((Reader *)&name.isArgDependent);
  if (uVar2 == 0) {
    local_b0.raw = (RawBrandedSchema *)InterfaceSchema::Method::getContainingInterface(&method);
    local_a8.raw = local_b0.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe();
    cppFullName((CppTypeName *)local_a0,this,local_a8,&local_f8);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_f8);
    InterfaceSchema::Method::getProto(&local_180,&method);
    proto._reader.capTable = local_180._reader.capTable;
    proto._reader.segment = local_180._reader.segment;
    proto._reader.data = local_180._reader.data;
    proto._reader.pointers = local_180._reader.pointers;
    proto._reader.dataSize = local_180._reader.dataSize;
    proto._reader.pointerCount = local_180._reader.pointerCount;
    proto._reader._38_2_ = local_180._reader._38_2_;
    proto._reader.nestingLimit = local_180._reader.nestingLimit;
    proto._reader._44_4_ = local_180._reader._44_4_;
    local_150 = (ArrayPtr<const_char>)protoName<capnp::schema::Method::Reader>(this,proto);
    params_1 = (StringPtr *)local_150.size_;
    toTitleCase(&local_140,this,(StringPtr)local_150);
    kj::str<kj::String,kj::StringPtr&>
              ((String *)local_128,(kj *)&local_140,(String *)&this_local,params_1);
    kj::String::~String(&local_140);
    capnp::schema::Node::Reader::getParameters(&local_1b0,(Reader *)&name.isArgDependent);
    uVar1 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_1b0);
    if (uVar1 == 0) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1c0,(String *)local_128);
      CppTypeName::addMemberType((CppTypeName *)local_a0,(StringPtr)local_1c0);
    }
    else {
      kj::StringPtr::StringPtr((StringPtr *)&local_1d0,(String *)local_128);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::Array(&local_1e8,(void *)0x0);
      CppTypeName::addMemberTemplate((CppTypeName *)local_a0,(StringPtr)local_1d0,&local_1e8);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_1e8);
    }
    local_1f0.raw = (RawBrandedSchema *)suffix_local.content.size_;
    other = kj::mv<capnp::(anonymous_namespace)::CppTypeName>((CppTypeName *)local_a0);
    CppTypeName::CppTypeName(&local_230,other);
    makeBrandDepInitializer(__return_storage_ptr__,this,local_1f0,&local_230);
    CppTypeName::~CppTypeName(&local_230);
    kj::String::~String((String *)local_128);
    CppTypeName::~CppTypeName((CppTypeName *)local_a0);
  }
  else {
    makeBrandDepInitializer(__return_storage_ptr__,this,(Schema)suffix_local.content.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(
      InterfaceSchema::Method method, StructSchema type, kj::StringPtr suffix) {
    auto typeProto = type.getProto();
    if (typeProto.getScopeId() == 0) {
      // This is an auto-generated params or results type.
      auto name = cppFullName(method.getContainingInterface(), kj::none);
      auto memberTypeName = kj::str(toTitleCase(protoName(method.getProto())), suffix);

      if (typeProto.getParameters().size() == 0) {
        name.addMemberType(memberTypeName);
      } else {
        // The method has implicit parameters (i.e. it's generic). For the purpose of the brand
        // dep initializer, we only want to supply the default AnyPointer variant, so just don't
        // pass any parameters here.
        name.addMemberTemplate(memberTypeName, nullptr);
      }
      return makeBrandDepInitializer(type, kj::mv(name));
    } else {
      return makeBrandDepInitializer(type);
    }
  }